

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GetSuffledPicturePaths.h
# Opt level: O0

bool GetShuffledPicturePaths::isImageFile(string *str)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  bool bVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_120;
  string local_e8;
  reference local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *supportedExtension;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  allocator<char> local_91;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  string local_68 [32];
  iterator local_48;
  size_type local_40;
  undefined1 local_38 [8];
  string imagePath;
  string *str_local;
  
  imagePath.field_2._8_8_ = str;
  toLowerCase((string *)local_38,str);
  if (isImageFile(std::__cxx11::string_const&)::supportedImageExtensions_abi_cxx11_ == '\0') {
    iVar2 = __cxa_guard_acquire(&isImageFile(std::__cxx11::string_const&)::
                                 supportedImageExtensions_abi_cxx11_);
    if (iVar2 != 0) {
      __range1._2_1_ = 1;
      local_90 = &local_88;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,".jpg",&local_91);
      local_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_68,".png",(allocator<char> *)((long)&__range1 + 3));
      __range1._2_1_ = 0;
      local_48 = &local_88;
      local_40 = 2;
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)((long)&__range1 + 1));
      __l._M_len = local_40;
      __l._M_array = local_48;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&isImageFile(std::__cxx11::string_const&)::supportedImageExtensions_abi_cxx11_,__l,
               (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)((long)&__range1 + 1));
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)((long)&__range1 + 1));
      local_120 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_48;
      do {
        local_120 = local_120 + -1;
        std::__cxx11::string::~string((string *)local_120);
      } while (local_120 != &local_88);
      std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 3));
      std::allocator<char>::~allocator(&local_91);
      __cxa_atexit(std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::~vector,
                   &isImageFile(std::__cxx11::string_const&)::supportedImageExtensions_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&isImageFile(std::__cxx11::string_const&)::
                           supportedImageExtensions_abi_cxx11_);
    }
  }
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(&isImageFile(std::__cxx11::string_const&)::supportedImageExtensions_abi_cxx11_);
  supportedExtension =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end(&isImageFile(std::__cxx11::string_const&)::supportedImageExtensions_abi_cxx11_);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&supportedExtension);
    if (!bVar1) {
      str_local._7_1_ = false;
LAB_00120cd7:
      std::__cxx11::string::~string((string *)local_38);
      return str_local._7_1_;
    }
    local_c8 = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&__end1);
    toLowerCase(&local_e8,(string *)imagePath.field_2._8_8_);
    lVar3 = std::__cxx11::string::find((string *)&local_e8,(ulong)local_c8);
    lVar4 = std::__cxx11::string::size();
    lVar5 = std::__cxx11::string::size();
    std::__cxx11::string::~string((string *)&local_e8);
    if (lVar3 == lVar4 - lVar5) {
      str_local._7_1_ = true;
      goto LAB_00120cd7;
    }
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

bool isImageFile(const std::string& str)
    {
        std::string imagePath = toLowerCase(str);

        static const std::vector<std::string> supportedImageExtensions = {".jpg", ".png"};
        for(const auto& supportedExtension : supportedImageExtensions) {
            if (toLowerCase(str).find(supportedExtension) == str.size() - supportedExtension.size()){
                return true;
            }
        }
        return false;
    }